

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CPrintStm *stm)

{
  bool bVar1;
  pointer pIVar2;
  CError local_120;
  CError local_f0;
  TypeInfo local_c0;
  undefined1 local_98 [8];
  string errorMessage;
  TypeInfo local_78;
  TypeInfo local_40;
  CPrintStm *local_18;
  CPrintStm *stm_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CPrintStm *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: CPrintStm\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->expression);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->expression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo(&local_40,ERROR_TYPE);
    bVar1 = ::operator==(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
    if (!bVar1) {
      TypeInfo::TypeInfo(&local_78,INT);
      bVar1 = ::operator!=(&this->lastCalculatedType,&local_78);
      TypeInfo::~TypeInfo(&local_78);
      if (bVar1) {
        TypeInfo::TypeInfo(&local_c0,INT);
        CError::GetTypeErrorMessage_abi_cxx11_
                  ((CError *)local_98,&local_c0,&this->lastCalculatedType);
        TypeInfo::~TypeInfo(&local_c0);
        CError::CError(&local_f0,(string *)local_98,
                       &(local_18->super_IStatement).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_f0);
        CError::~CError(&local_f0);
        std::__cxx11::string::~string((string *)local_98);
      }
    }
  }
  else {
    CError::CError(&local_120,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(local_18->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_120);
    CError::~CError(&local_120);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CPrintStm &stm ) 
{
    std::cout << "typechecker: CPrintStm\n";

    if( stm.expression ) {
        stm.expression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != enums::TPrimitiveType::INT ) {
            auto errorMessage = CError::GetTypeErrorMessage(enums::TPrimitiveType::INT, lastCalculatedType);
            errors.push_back(CError(errorMessage, stm.position));
        }
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}